

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O0

bool __thiscall
tinyusdz::crate::CrateReader::ReadTokenListOp(CrateReader *this,ListOp<tinyusdz::Token> *d)

{
  bool bVar1;
  undefined1 local_c8 [8];
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> items_5;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> items_4;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> items_3;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> items_2;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> items_1;
  undefined1 local_48 [8];
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> items;
  anon_class_8_1_8991fb9c ReadFn;
  ListOpHeader h;
  ListOp<tinyusdz::Token> *d_local;
  CrateReader *this_local;
  
  ListOpHeader::ListOpHeader((ListOpHeader *)((long)&ReadFn.this + 7));
  bVar1 = StreamReader::read1(this->_sr,(uint8_t *)((long)&ReadFn.this + 7));
  if (bVar1) {
    bVar1 = ListOpHeader::IsExplicit((ListOpHeader *)((long)&ReadFn.this + 7));
    if (bVar1) {
      ListOp<tinyusdz::Token>::ClearAndMakeExplicit(d);
    }
    items.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)this;
    bVar1 = ListOpHeader::HasExplicitItems((ListOpHeader *)((long)&ReadFn.this + 7));
    if (bVar1) {
      ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::vector
                ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)local_48);
      bVar1 = ReadTokenListOp::anon_class_8_1_8991fb9c::operator()
                        ((anon_class_8_1_8991fb9c *)
                         &items.
                          super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,
                         (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)local_48);
      if (bVar1) {
        ListOp<tinyusdz::Token>::SetExplicitItems
                  (d,(vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)local_48);
      }
      else {
        ::std::__cxx11::string::operator+=
                  ((string *)&this->_err,"Failed to read ListOp::ExplicitItems.\n");
        this_local._7_1_ = 0;
      }
      ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::~vector
                ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)local_48);
      if (!bVar1) goto LAB_0024b11b;
    }
    bVar1 = ListOpHeader::HasAddedItems((ListOpHeader *)((long)&ReadFn.this + 7));
    if (bVar1) {
      ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::vector
                ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                 &items_2.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      bVar1 = ReadTokenListOp::anon_class_8_1_8991fb9c::operator()
                        ((anon_class_8_1_8991fb9c *)
                         &items.
                          super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,
                         (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                         &items_2.
                          super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
      if (bVar1) {
        ListOp<tinyusdz::Token>::SetAddedItems
                  (d,(vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                     &items_2.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      else {
        ::std::__cxx11::string::operator+=
                  ((string *)&this->_err,"Failed to read ListOp::AddedItems.\n");
        this_local._7_1_ = 0;
      }
      ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::~vector
                ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                 &items_2.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      if (!bVar1) goto LAB_0024b11b;
    }
    bVar1 = ListOpHeader::HasPrependedItems((ListOpHeader *)((long)&ReadFn.this + 7));
    if (bVar1) {
      ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::vector
                ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                 &items_3.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      bVar1 = ReadTokenListOp::anon_class_8_1_8991fb9c::operator()
                        ((anon_class_8_1_8991fb9c *)
                         &items.
                          super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,
                         (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                         &items_3.
                          super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
      if (bVar1) {
        ListOp<tinyusdz::Token>::SetPrependedItems
                  (d,(vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                     &items_3.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      else {
        ::std::__cxx11::string::operator+=
                  ((string *)&this->_err,"Failed to read ListOp::PrependedItems.\n");
        this_local._7_1_ = 0;
      }
      ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::~vector
                ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                 &items_3.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      if (!bVar1) goto LAB_0024b11b;
    }
    bVar1 = ListOpHeader::HasAppendedItems((ListOpHeader *)((long)&ReadFn.this + 7));
    if (bVar1) {
      ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::vector
                ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                 &items_4.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      bVar1 = ReadTokenListOp::anon_class_8_1_8991fb9c::operator()
                        ((anon_class_8_1_8991fb9c *)
                         &items.
                          super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,
                         (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                         &items_4.
                          super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
      if (bVar1) {
        ListOp<tinyusdz::Token>::SetAppendedItems
                  (d,(vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                     &items_4.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      else {
        ::std::__cxx11::string::operator+=
                  ((string *)&this->_err,"Failed to read ListOp::AppendedItems.\n");
        this_local._7_1_ = 0;
      }
      ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::~vector
                ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                 &items_4.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      if (!bVar1) goto LAB_0024b11b;
    }
    bVar1 = ListOpHeader::HasDeletedItems((ListOpHeader *)((long)&ReadFn.this + 7));
    if (bVar1) {
      ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::vector
                ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                 &items_5.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      bVar1 = ReadTokenListOp::anon_class_8_1_8991fb9c::operator()
                        ((anon_class_8_1_8991fb9c *)
                         &items.
                          super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,
                         (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                         &items_5.
                          super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
      if (bVar1) {
        ListOp<tinyusdz::Token>::SetDeletedItems
                  (d,(vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                     &items_5.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      else {
        ::std::__cxx11::string::operator+=
                  ((string *)&this->_err,"Failed to read ListOp::DeletedItems.\n");
        this_local._7_1_ = 0;
      }
      ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::~vector
                ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                 &items_5.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      if (!bVar1) goto LAB_0024b11b;
    }
    bVar1 = ListOpHeader::HasOrderedItems((ListOpHeader *)((long)&ReadFn.this + 7));
    if (bVar1) {
      ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::vector
                ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)local_c8);
      bVar1 = ReadTokenListOp::anon_class_8_1_8991fb9c::operator()
                        ((anon_class_8_1_8991fb9c *)
                         &items.
                          super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,
                         (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)local_c8);
      if (bVar1) {
        ListOp<tinyusdz::Token>::SetOrderedItems
                  (d,(vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)local_c8);
      }
      else {
        ::std::__cxx11::string::operator+=
                  ((string *)&this->_err,"Failed to read ListOp::OrderedItems.\n");
        this_local._7_1_ = 0;
      }
      ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::~vector
                ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)local_c8);
      if (!bVar1) goto LAB_0024b11b;
    }
    this_local._7_1_ = 1;
  }
  else {
    ::std::__cxx11::string::operator+=((string *)&this->_err,"Failed to read ListOpHeader\n");
    this_local._7_1_ = 0;
  }
LAB_0024b11b:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool CrateReader::ReadTokenListOp(ListOp<value::token> *d) {
  // read ListOpHeader
  ListOpHeader h;
  if (!_sr->read1(&h.bits)) {
    _err += "Failed to read ListOpHeader\n";
    return false;
  }

  if (h.IsExplicit()) {
    d->ClearAndMakeExplicit();
  }

  // array data is not compressed
  auto ReadFn = [this](std::vector<value::token> &result) -> bool {
    uint64_t n;
    if (!_sr->read8(&n)) {
      _err += "Failed to read # of elements in ListOp.\n";
      return false;
    }

    if (n > _config.maxArrayElements) {
      _err += "Too many ListOp elements.\n";
      return false;
    }

    CHECK_MEMORY_USAGE(size_t(n) * sizeof(crate::Index));

    std::vector<crate::Index> ivalue(static_cast<size_t>(n));

    if (!_sr->read(size_t(n) * sizeof(crate::Index),
                   size_t(n) * sizeof(crate::Index),
                   reinterpret_cast<uint8_t *>(ivalue.data()))) {
      _err += "Failed to read ListOp data.\n";
      return false;
    }

    // reconstruct
    result.resize(static_cast<size_t>(n));
    for (size_t i = 0; i < n; i++) {
      if (auto v = GetToken(ivalue[i])) {
        result[i] = v.value();
      } else {
        return false;
      }
    }

    return true;
  };

  if (h.HasExplicitItems()) {
    std::vector<value::token> items;
    if (!ReadFn(items)) {
      _err += "Failed to read ListOp::ExplicitItems.\n";
      return false;
    }

    d->SetExplicitItems(items);
  }

  if (h.HasAddedItems()) {
    std::vector<value::token> items;
    if (!ReadFn(items)) {
      _err += "Failed to read ListOp::AddedItems.\n";
      return false;
    }

    d->SetAddedItems(items);
  }

  if (h.HasPrependedItems()) {
    std::vector<value::token> items;
    if (!ReadFn(items)) {
      _err += "Failed to read ListOp::PrependedItems.\n";
      return false;
    }

    d->SetPrependedItems(items);
  }

  if (h.HasAppendedItems()) {
    std::vector<value::token> items;
    if (!ReadFn(items)) {
      _err += "Failed to read ListOp::AppendedItems.\n";
      return false;
    }

    d->SetAppendedItems(items);
  }

  if (h.HasDeletedItems()) {
    std::vector<value::token> items;
    if (!ReadFn(items)) {
      _err += "Failed to read ListOp::DeletedItems.\n";
      return false;
    }

    d->SetDeletedItems(items);
  }

  if (h.HasOrderedItems()) {
    std::vector<value::token> items;
    if (!ReadFn(items)) {
      _err += "Failed to read ListOp::OrderedItems.\n";
      return false;
    }

    d->SetOrderedItems(items);
  }

  return true;
}